

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O3

void __thiscall
Imf_3_2::DeepTiledOutputFile::DeepTiledOutputFile
          (DeepTiledOutputFile *this,OStream *os,Header *header,int numThreads)

{
  Data **ppDVar1;
  int iVar2;
  Data *pDVar3;
  OutputStreamMutex *pOVar4;
  undefined4 extraout_var;
  uint64_t uVar5;
  stringstream _iex_replace_s;
  
  GenericOutputFile::GenericOutputFile(&this->super_GenericOutputFile);
  (this->super_GenericOutputFile)._vptr_GenericOutputFile =
       (_func_int **)&PTR__DeepTiledOutputFile_003d6528;
  pDVar3 = (Data *)operator_new(0x1d0);
  Data::Data(pDVar3,numThreads);
  ppDVar1 = &this->_data;
  *ppDVar1 = pDVar3;
  pOVar4 = (OutputStreamMutex *)operator_new(0x38);
  (pOVar4->super_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  pOVar4->os = (OStream *)0x0;
  *(undefined8 *)((long)&(pOVar4->super_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (pOVar4->super_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (pOVar4->super_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(pOVar4->super_mutex).super___mutex_base._M_mutex + 8) = 0;
  pOVar4->currentPosition = 0;
  pDVar3->_streamData = pOVar4;
  pDVar3->_deleteStream = false;
  Header::sanityCheck(header,true,false);
  this->_data->_streamData->os = os;
  initialize(this,header);
  iVar2 = (*(*ppDVar1)->_streamData->os->_vptr_OStream[3])();
  pDVar3 = this->_data;
  pOVar4 = pDVar3->_streamData;
  pOVar4->currentPosition = CONCAT44(extraout_var,iVar2);
  GenericOutputFile::writeMagicNumberAndVersionField
            (&this->super_GenericOutputFile,pOVar4->os,&pDVar3->header);
  uVar5 = Header::writeTo(&(*ppDVar1)->header,(*ppDVar1)->_streamData->os,true);
  pDVar3 = *ppDVar1;
  pDVar3->previewPosition = uVar5;
  uVar5 = TileOffsets::writeTo(&pDVar3->tileOffsets,pDVar3->_streamData->os);
  pDVar3 = *ppDVar1;
  pDVar3->tileOffsetsPosition = uVar5;
  pDVar3->multipart = false;
  return;
}

Assistant:

DeepTiledOutputFile::DeepTiledOutputFile (
    OPENEXR_IMF_INTERNAL_NAMESPACE::OStream& os,
    const Header&                            header,
    int                                      numThreads)
    : _data (new Data (numThreads))
{
    _data->_streamData   = new OutputStreamMutex ();
    _data->_deleteStream = false;

    try
    {
        header.sanityCheck (true);
        _data->_streamData->os = &os;
        initialize (header);
        _data->_streamData->currentPosition = _data->_streamData->os->tellp ();

        // Write header and empty offset table to the file.
        writeMagicNumberAndVersionField (
            *_data->_streamData->os, _data->header);
        _data->previewPosition =
            _data->header.writeTo (*_data->_streamData->os, true);
        _data->tileOffsetsPosition =
            _data->tileOffsets.writeTo (*_data->_streamData->os);
        _data->multipart = false;
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        if (_data && _data->_streamData) delete _data->_streamData;
        if (_data) delete _data;

        REPLACE_EXC (
            e,
            "Cannot open image file "
            "\"" << os.fileName ()
                 << "\". " << e.what ());
        throw;
    }
    catch (...)
    {
        if (_data && _data->_streamData) delete _data->_streamData;
        if (_data) delete _data;

        throw;
    }
}